

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmfw.c
# Opt level: O0

MMFWEntry * MMFW_EntryAtIndex(MMFW *mmfw,int i)

{
  int iVar1;
  MMFWSoundEntry *pMVar2;
  MMFWPictureEntry *pMVar3;
  MMFWFilmEntry *pMVar4;
  MMFWEntry *entry;
  int i_local;
  MMFW *mmfw_local;
  
  mmfw_local = (MMFW *)malloc(0x10);
  if (mmfw_local == (MMFW *)0x0) {
    mmfw_local = (MMFW *)0x0;
  }
  else {
    *(MMFWKind *)&mmfw_local->fp = mmfw->kind;
    iVar1 = *(int *)&mmfw_local->fp;
    if (iVar1 == 1) {
      pMVar2 = MMFWSoundEntry_New(mmfw,i);
      *(MMFWSoundEntry **)&mmfw_local->kind = pMVar2;
    }
    else if (iVar1 == 2) {
      pMVar3 = MMFWPictureEntry_New(mmfw,i);
      *(MMFWPictureEntry **)&mmfw_local->kind = pMVar3;
    }
    else if (iVar1 == 3) {
      pMVar4 = MMFWFilmEntry_New(mmfw,i);
      *(MMFWFilmEntry **)&mmfw_local->kind = pMVar4;
    }
  }
  return (MMFWEntry *)mmfw_local;
}

Assistant:

MMFWEntry *
MMFW_EntryAtIndex(MMFW *mmfw, int i)
{
	MMFWEntry *entry = malloc(sizeof(MMFWEntry));

	if (!entry) {
		return NULL;
	}

	entry->kind = mmfw->kind;

	switch (entry->kind) {
	case MMFW_KIND_SOUNDS:
		entry->entry.sound = MMFWSoundEntry_New(mmfw, i);
		break;
	case MMFW_KIND_PICTURES:
		entry->entry.picture = MMFWPictureEntry_New(mmfw, i);
		break;
	case MMFW_KIND_FILMS:
		entry->entry.film = MMFWFilmEntry_New(mmfw, i);
		break;
	default:
		; /* XXX NOTREACHED */
	}

	return entry;
}